

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_internal_entry.h
# Opt level: O0

__pid_t __thiscall ParallelManager::wait(ParallelManager *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  unique_lock<std::mutex> lck;
  mutex_type *in_stack_ffffffffffffffb8;
  condition_variable *this_00;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffffd0;
  condition_variable local_18 [16];
  ParallelManager *local_8;
  
  this_00 = local_18;
  local_8 = this;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)this,in_stack_ffffffffffffffb8);
  std::condition_variable::wait<ParallelManager::wait()::_lambda()_1_>
            (this_00,(unique_lock<std::mutex> *)this,in_stack_ffffffffffffffd0);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this);
  return extraout_EAX;
}

Assistant:

void wait()
	{
		std::unique_lock<std::mutex> lck(m_lock);
		m_complete.wait(lck, [this]{ return m_is_cancelled || m_done_count == m_task_count; });
	}